

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

array_container_t * array_container_create_given_capacity(int32_t size)

{
  uint16_t *puVar1;
  int in_EDI;
  array_container_t *container;
  array_container_t *local_8;
  
  local_8 = (array_container_t *)roaring_malloc(0x112ac2);
  if (local_8 == (array_container_t *)0x0) {
    local_8 = (array_container_t *)0x0;
  }
  else {
    if (in_EDI < 1) {
      local_8->array = (uint16_t *)0x0;
    }
    else {
      puVar1 = (uint16_t *)roaring_malloc(0x112af9);
      local_8->array = puVar1;
      if (puVar1 == (uint16_t *)0x0) {
        roaring_free((void *)0x112b10);
        return (array_container_t *)0x0;
      }
    }
    local_8->capacity = in_EDI;
    local_8->cardinality = 0;
  }
  return local_8;
}

Assistant:

array_container_t *array_container_create_given_capacity(int32_t size) {
    array_container_t *container;

    if ((container = (array_container_t *)roaring_malloc(
             sizeof(array_container_t))) == NULL) {
        return NULL;
    }

    if (size <= 0) {  // we don't want to rely on malloc(0)
        container->array = NULL;
    } else if ((container->array = (uint16_t *)roaring_malloc(sizeof(uint16_t) *
                                                              size)) == NULL) {
        roaring_free(container);
        return NULL;
    }

    container->capacity = size;
    container->cardinality = 0;

    return container;
}